

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall Alg::opim(Alg *this,int targetSize,size_t numRRsets,double delta,int mode)

{
  uint uVar1;
  size_t sVar2;
  TResult *pTVar3;
  ResultInfo *this_00;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  Timer local_50;
  
  local_50.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_50.__processName = "OPIM";
  local_50.__LastTime.__d.__r = local_50.__StartTime.__d.__r;
  local_50.__EndTime.__d.__r = local_50.__StartTime.__d.__r;
  dVar5 = log(2.0 / delta);
  dVar6 = log(2.0 / delta);
  HyperGraph::build_n_RRsets(&this->__hyperG,numRRsets >> 1);
  HyperGraph::build_n_RRsets(&this->__hyperGVldt,numRRsets >> 1);
  this->__numRRsets = (this->__hyperG).__numRRsets;
  dVar7 = Timer::get_operation_time(&local_50);
  dVar8 = max_cover(this,targetSize,mode);
  dVar9 = Timer::get_operation_time(&local_50);
  dVar10 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
  sVar2 = this->__numRRsets;
  uVar1 = this->__numV;
  if (mode == 1) {
    dVar17 = this->__boundLast;
  }
  else if (mode == 2) {
    dVar17 = this->__boundMin;
  }
  else {
    dVar17 = dVar8 / 0.6321205588285577;
  }
  auVar16._8_4_ = (int)(sVar2 >> 0x20);
  auVar16._0_8_ = sVar2;
  auVar16._12_4_ = 0x45300000;
  dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  auVar15._0_8_ = dVar5 * 2.0;
  auVar15._8_8_ = dVar14 * dVar10;
  auVar13._8_8_ = (double)uVar1;
  auVar13._0_8_ = 0x4022000000000000;
  auVar16 = divpd(auVar15,auVar13);
  dVar11 = auVar16._8_8_ + auVar16._0_8_;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar12 = dVar5 * 0.5;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar6 = dVar6 * 0.5;
  dVar14 = (dVar17 * dVar14) / (double)uVar1 + dVar6;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = ((dVar11 - dVar12) * (dVar11 - dVar12) + dVar5 / -18.0) /
          ((dVar14 + dVar6) * (dVar14 + dVar6));
  pTVar3 = this->__tRes;
  pTVar3->__Approx = dVar6;
  dVar5 = Timer::get_total_time(&local_50);
  pTVar3->__RunningTime = dVar5;
  this_00 = this->__tRes;
  this_00->__Influence = dVar10;
  this_00->__InfluenceOriginal = dVar8;
  ResultInfo::set_seed_vec(this_00,&this->__vecSeed);
  this->__tRes->__RRsetsSize = this->__numRRsets * 2;
  std::operator<<((ostream *)&std::cout,"==>OPIM approx. (max-cover): ");
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar4," (");
  poVar4 = std::ostream::_M_insert<double>(dVar8 / dVar17);
  std::operator<<(poVar4,")\n");
  std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar4 = std::ostream::_M_insert<double>(dVar7);
  std::operator<<(poVar4,", ");
  poVar4 = std::ostream::_M_insert<double>(dVar9);
  std::operator<<(poVar4,'\n');
  pTVar3 = this->__tRes;
  dVar5 = effic_inf_valid_algo(this);
  pTVar3->__Influence = dVar5;
  return dVar6;
}

Assistant:

double Alg::opim(const int targetSize, const size_t numRRsets, const double delta, const int mode)
{
    Timer timerOPIM("OPIM");
    const double e = exp(1);
    const double approx = 1 - 1.0 / e;
    const double a1 = log(2.0 / delta);
    const double a2 = log(2.0 / delta);
    __hyperG.build_n_RRsets(numRRsets / 2); // R1
    __hyperGVldt.build_n_RRsets(numRRsets / 2); // R2
    __numRRsets = __hyperG.get_RR_sets_size();
    const auto time1 = timerOPIM.get_operation_time();
    const auto infSelf = max_cover(targetSize, mode);
    const auto time2 = timerOPIM.get_operation_time();
    const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
    const auto degVldt = infVldt * __numRRsets / __numV;
    auto upperBound = infSelf / approx;
    if (mode == 1) upperBound = __boundLast;
    else if (mode == 2) upperBound = __boundMin;
    const auto upperDegOPT = upperBound * __numRRsets / __numV;
    const auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
    const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
    const auto approxOPIM = lowerSelect / upperOPT;
    //guaranteeOpt = opt_error(degVldt, degSelfUpper, delta);
    __tRes.set_approximation(approxOPIM);
    __tRes.set_running_time(timerOPIM.get_total_time());
    __tRes.set_influence(infVldt);
    __tRes.set_influence_original(infSelf);
    __tRes.set_seed_vec(__vecSeed);
    __tRes.set_RR_sets_size(__numRRsets * 2);
    std::cout << "==>OPIM approx. (max-cover): " << approxOPIM << " (" << infSelf / upperBound << ")\n";
    std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 << '\n';
    __tRes.set_influence(effic_inf_valid_algo());
    return approxOPIM;
}